

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

int Cbs2_ManSolve2_rec(Cbs2_Man_t *p,int Level)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pVar;
  int iVar7;
  long lVar8;
  int iVar9;
  int iDecLit2;
  int local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar4 = (p->pProp).iHead;
  if (iVar4 == (p->pProp).iTail) {
    __assert_fail("!Cbs2_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x523,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
  }
  iVar3 = Cbs2_ManPropagate2(p,Level);
  if (iVar3 == 0) {
    if ((p->pProp).iHead != (p->pProp).iTail) {
      __assert_fail("Cbs2_QueIsEmpty(&p->pProp)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                    ,0x527,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
    }
    iVar4 = Cbs2_ManUpdateFrontier(p,iVar4,&local_4c);
    iVar3 = 0;
    if (iVar4 == 0) {
      iVar4 = (p->Pars).nJustThis;
      iVar7 = (p->pJust).iTail - (p->pJust).iHead;
      if (iVar7 < iVar4) {
        iVar7 = iVar4;
      }
      (p->Pars).nJustThis = iVar7;
      iVar4 = Cbs2_ManCheckLimits(p);
      if (iVar4 == 0) {
        if ((p->Pars).fUseHighest == 0) {
          __assert_fail("p->Pars.fUseHighest",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                        ,0x537,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
        }
        iVar4 = (p->pProp).iHead;
        local_48._0_4_ = (p->pJust).iHead;
        local_48._4_4_ = (p->pJust).iTail;
        uStack_40 = 0;
        iVar3 = Cbs2_ManDecideHighest(p);
        pVar = Gia_ManObj(p->pAig,iVar3);
        iVar7 = Cbs2_VarIsJust(p,pVar,iVar3);
        if (iVar7 == 0) {
          __assert_fail("Cbs2_VarIsJust(p, pVar, iVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                        ,0x53a,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
        }
        iVar7 = Gia_ObjRefNum(p->pAig,pVar + -(*(ulong *)pVar & 0x1fffffff));
        iVar5 = Gia_ObjRefNum(p->pAig,pVar + -((ulong)*(uint *)&pVar->field_0x4 & 0x1fffffff));
        if (iVar5 < iVar7) {
          iVar3 = Gia_ObjFaninLit0(pVar,iVar3);
        }
        else {
          iVar3 = Gia_ObjFaninLit1(pVar,iVar3);
        }
        iVar7 = Abc_LitNot(iVar3);
        iVar9 = Level + 1;
        Cbs2_ManAssign(p,iVar7,iVar9,0,0);
        iVar5 = Cbs2_ManSolve2_rec(p,iVar9);
        iVar3 = 0;
        if ((iVar5 != 0) &&
           (iVar2 = (p->pClauses).pData[(long)iVar5 + 1], iVar6 = Abc_Lit2Var(iVar7), iVar3 = iVar5,
           iVar2 == iVar6)) {
          Cbs2_ManCancelUntil(p,iVar4);
          (p->pJust).iHead = (undefined4)local_48;
          (p->pJust).iTail = local_48._4_4_;
          iVar4 = Abc_LitNot(iVar7);
          Cbs2_ManAssign(p,iVar4,iVar9,0,0);
          iVar4 = Cbs2_ManSolve2_rec(p,iVar9);
          iVar3 = 0;
          if (iVar4 != 0) {
            lVar8 = (long)iVar4;
            iVar9 = (p->pClauses).pData[lVar8 + 1];
            iVar7 = Abc_Lit2Var(iVar7);
            iVar3 = iVar4;
            if (iVar9 == iVar7) {
              iVar3 = Cbs2_ManResolve(p,iVar5,iVar4,(int)lVar8);
              Cbs2_ManBumpClause(p,iVar5);
              piVar1 = &(p->Pars).nBTThis;
              *piVar1 = *piVar1 + 1;
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int Cbs2_ManSolve2_rec( Cbs2_Man_t * p, int Level )
{ 
    Gia_Obj_t * pVar;
    Cbs2_Que_t * pQue = &(p->pClauses);
    int iPropHead, iJustHead, iJustTail;
    int hClause, hLearn0, hLearn1, iVar, iDecLit, iDecLit2;
    int iPropHeadOld = p->pProp.iHead;
    // propagate assignments
    assert( !Cbs2_QueIsEmpty(&p->pProp) );
    if ( (hClause = Cbs2_ManPropagate2( p, Level )) )
        return hClause;
    // check for satisfying assignment
    assert( Cbs2_QueIsEmpty(&p->pProp) );
//    if ( Cbs2_QueIsEmpty(&p->pJust) )
//        return 0;
    if ( Cbs2_ManUpdateFrontier(p, iPropHeadOld, &iDecLit2) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Cbs2_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
//    Cbs2_QueStore( &p->pJust, &iJustHead, &iJustTail );
    iJustHead = p->pJust.iHead;
    iJustTail = p->pJust.iTail;
    // find the decision variable

    assert( p->Pars.fUseHighest );
    iVar = Cbs2_ManDecideHighest( p );
    pVar = Gia_ManObj( p->pAig, iVar );
    assert( Cbs2_VarIsJust(p, pVar, iVar) );
    // chose decision variable using fanout count
    if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
//    if ( Vec_IntEntry(&p->vActivity, Gia_ObjFaninId0(pVar, iVar)) > Vec_IntEntry(&p->vActivity, Gia_ObjFaninId1(pVar, iVar)) )
        iDecLit = Abc_LitNot(Gia_ObjFaninLit0(pVar, iVar));
    else
        iDecLit = Abc_LitNot(Gia_ObjFaninLit1(pVar, iVar));

    //iDecLit = iDecLit2;

    // decide on first fanin
    Cbs2_ManAssign( p, iDecLit, Level+1, 0, 0 );
    if ( !(hLearn0 = Cbs2_ManSolve2_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn0+1] != Abc_Lit2Var(iDecLit) )
        return hLearn0;
    Cbs2_ManCancelUntil( p, iPropHead );
    Cbs2_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Cbs2_ManAssign( p, Abc_LitNot(iDecLit), Level+1, 0, 0 );
    if ( !(hLearn1 = Cbs2_ManSolve2_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn1+1] != Abc_Lit2Var(iDecLit) )
        return hLearn1;
    hClause = Cbs2_ManResolve( p, Level, hLearn0, hLearn1 );
    Cbs2_ManBumpClause( p, hClause );
    //Cbs2_ManPrintCube( p, Level, hClause );
//    if ( Level > Cbs2_ClauseDecLevel(p, hClause) )
//        p->Pars.nBTThisNc++;
    p->Pars.nBTThis++;
    return hClause;
}